

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resource.cpp
# Opt level: O1

void Corrade::Utility::Resource::overrideGroup(StringView group,StringView configurationFile)

{
  StringView value;
  _Rb_tree<Corrade::Containers::BasicStringView<char_const>,std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>,std::_Select1st<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>,std::less<Corrade::Containers::BasicStringView<char_const>>,std::allocator<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>>
  *this;
  ResourceGroup *pRVar1;
  ostream *output;
  Debug *pDVar2;
  char *pcVar3;
  char *pcVar4;
  String *this_00;
  String *pSVar5;
  String *extraout_RDX;
  pair<std::_Rb_tree_iterator<std::pair<const_Corrade::Containers::BasicStringView<const_char>,_Corrade::Containers::String>_>,_bool>
  pVar6;
  StringView view;
  StringView name;
  BasicStringView<const_char> local_60;
  Error local_50;
  String local_28;
  
  pcVar3 = (char *)configurationFile._sizePlusFlags;
  this_00 = (String *)configurationFile._data;
  local_60._sizePlusFlags = group._sizePlusFlags;
  local_60._data = group._data;
  pcVar4 = pcVar3;
  pSVar5 = this_00;
  if ((_Rb_tree<Corrade::Containers::BasicStringView<char_const>,std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>,std::_Select1st<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>,std::less<Corrade::Containers::BasicStringView<char_const>>,std::allocator<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>>
       *)_ZN7Corrade7Utility12_GLOBAL__N_115resourceGlobalsE_1 ==
      (_Rb_tree<Corrade::Containers::BasicStringView<char_const>,std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>,std::_Select1st<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>,std::less<Corrade::Containers::BasicStringView<char_const>>,std::allocator<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>>
       *)0x0) {
    if (overrideGroup(Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>)
        ::overrideGroups == '\0') {
      overrideGroup();
      pSVar5 = extraout_RDX;
    }
    _ZN7Corrade7Utility12_GLOBAL__N_115resourceGlobalsE_1 = &overrideGroup::overrideGroups;
  }
  name._sizePlusFlags = (size_t)pSVar5;
  name._data = (char *)local_60._sizePlusFlags;
  pRVar1 = anon_unknown_3::findGroup((anon_unknown_3 *)local_60._data,name);
  if (pRVar1 != (ResourceGroup *)0x0) {
    view._sizePlusFlags = (size_t)pcVar4;
    view._data = pcVar3;
    Containers::String::nullTerminatedGlobalView((String *)&local_50,this_00,view);
    this = (_Rb_tree<Corrade::Containers::BasicStringView<char_const>,std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>,std::_Select1st<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>,std::less<Corrade::Containers::BasicStringView<char_const>>,std::allocator<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>>
            *)_ZN7Corrade7Utility12_GLOBAL__N_115resourceGlobalsE_1;
    Containers::String::String(&local_28);
    pVar6 = std::
            _Rb_tree<Corrade::Containers::BasicStringView<char_const>,std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>,std::_Select1st<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>,std::less<Corrade::Containers::BasicStringView<char_const>>,std::allocator<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>>
            ::
            _M_emplace_unique<Corrade::Containers::BasicStringView<char_const>const&,Corrade::Containers::String>
                      (this,&local_60,&local_28);
    Containers::String::operator=
              ((String *)&pVar6.first._M_node._M_node[1]._M_left,(String *)&local_50);
    Containers::String::~String(&local_28);
    Containers::String::~String((String *)&local_50);
    return;
  }
  output = Error::defaultOutput();
  Error::Error(&local_50,output,(Flags)0x0);
  pDVar2 = Debug::operator<<(&local_50.super_Debug,"Utility::Resource::overrideGroup(): group \'");
  (pDVar2->_immediateFlags)._value = (pDVar2->_immediateFlags)._value | 4;
  value._sizePlusFlags = local_60._sizePlusFlags;
  value._data = local_60._data;
  pDVar2 = Debug::operator<<(pDVar2,value);
  (pDVar2->_immediateFlags)._value = (pDVar2->_immediateFlags)._value | 4;
  Debug::operator<<(pDVar2,"\' was not found");
  Error::~Error(&local_50);
  abort();
}

Assistant:

void Resource::overrideGroup(const Containers::StringView group, const Containers::StringView configurationFile) {
    if(!resourceGlobals.overrideGroups) {
        static std::map<Containers::StringView, Containers::String> overrideGroups;
        resourceGlobals.overrideGroups = &overrideGroups;
    }

    CORRADE_ASSERT(findGroup(group),
        "Utility::Resource::overrideGroup(): group '" << Debug::nospace << group << Debug::nospace << "' was not found", );
    /* This group can be already overridden from before, so insert if not there
       yet and then update the filename */
    resourceGlobals.overrideGroups->emplace(group, Containers::String{}).first->second = Containers::String::nullTerminatedGlobalView(configurationFile);
}